

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchMan.c
# Opt level: O0

void Dch_ManSatSolverRecycle(Dch_Man_t *p)

{
  Dch_Man_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  sat_solver *psVar3;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Dch_Man_t *pDStack_10;
  int Lit;
  Dch_Man_t *p_local;
  
  pDStack_10 = p;
  if (p->pSat != (sat_solver *)0x0) {
    for (local_24 = 0; iVar1 = Vec_PtrSize(pDStack_10->vUsedNodes), local_24 < iVar1;
        local_24 = local_24 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pDStack_10->vUsedNodes,local_24);
      Dch_ObjSetSatNum(pDStack_10,pAVar2,0);
    }
    Vec_PtrClear(pDStack_10->vUsedNodes);
    sat_solver_delete(pDStack_10->pSat);
  }
  psVar3 = sat_solver_new();
  pDStack_10->pSat = psVar3;
  sat_solver_setnvars(pDStack_10->pSat,1000);
  pDStack_10->nSatVars = 1;
  pObj._4_4_ = toLit(pDStack_10->nSatVars);
  if (pDStack_10->pPars->fPolarFlip != 0) {
    pObj._4_4_ = lit_neg(pObj._4_4_);
  }
  sat_solver_addclause(pDStack_10->pSat,(lit *)((long)&pObj + 4),(lit *)&stack0xfffffffffffffff0);
  p_00 = pDStack_10;
  pAVar2 = Aig_ManConst1(pDStack_10->pAigFraig);
  iVar1 = pDStack_10->nSatVars;
  pDStack_10->nSatVars = iVar1 + 1;
  Dch_ObjSetSatNum(p_00,pAVar2,iVar1);
  pDStack_10->nRecycles = pDStack_10->nRecycles + 1;
  pDStack_10->nCallsSince = 0;
  return;
}

Assistant:

void Dch_ManSatSolverRecycle( Dch_Man_t * p )
{
    int Lit;
    if ( p->pSat )
    {
        Aig_Obj_t * pObj;
        int i;
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vUsedNodes, pObj, i )
            Dch_ObjSetSatNum( p, pObj, 0 );
        Vec_PtrClear( p->vUsedNodes );
//        memset( p->pSatVars, 0, sizeof(int) * Aig_ManObjNumMax(p->pAigTotal) );
        sat_solver_delete( p->pSat );
    }
    p->pSat = sat_solver_new();
    sat_solver_setnvars( p->pSat, 1000 );
    // var 0 is not used
    // var 1 is reserved for const1 node - add the clause
    p->nSatVars = 1;
//    p->nSatVars = 0;
    Lit = toLit( p->nSatVars );
    if ( p->pPars->fPolarFlip )
        Lit = lit_neg( Lit );
    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    Dch_ObjSetSatNum( p, Aig_ManConst1(p->pAigFraig), p->nSatVars++ );

    p->nRecycles++;
    p->nCallsSince = 0;
}